

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool __thiscall AnyType::OutputFromType<Boolean>(AnyType *this,ostream *os)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_30 [8];
  Boolean t;
  
  t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
  local_30 = (undefined1  [8])&PTR_EncodedSize_00151878;
  t.super_DerBase.cbData._0_1_ = '\0';
  bVar1 = ConvertToType<Boolean>(this,(Boolean *)local_30);
  if (bVar1) {
    pcVar2 = "true";
    if ((char)t.super_DerBase.cbData == '\0') {
      pcVar2 = "false";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,pcVar2,(ulong)((char)t.super_DerBase.cbData == '\0') | 4);
  }
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }